

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void ActionUnserialize::
     SerReadWriteMany<ParamsStream<SpanReader&,TransactionSerParams>,COutPoint&,CScript&,unsigned_int&>
               (ParamsStream<SpanReader_&,_TransactionSerParams> *s,COutPoint *args,CScript *args_1,
               uint *args_2)

{
  uint *__nbytes;
  long in_FS_OFFSET;
  uint32_t obj;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = args_2;
  COutPoint::
  SerializationOps<ParamsStream<SpanReader&,TransactionSerParams>,COutPoint,ActionUnserialize>
            (args,s);
  Unserialize<ParamsStream<SpanReader&,TransactionSerParams>,28u,unsigned_char>
            (s,&args_1->super_CScriptBase);
  SpanReader::read(s->m_substream,(int)&local_24,(void *)0x4,(size_t)__nbytes);
  *args_2 = local_24;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }